

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::reportArray(HSimplexNla *this,string *message,HVector *vector,bool force)

{
  bool force_00;
  byte in_CL;
  HVector *in_RDX;
  string *in_RSI;
  string *in_RDI;
  HSimplexNla *unaff_retaddr;
  string local_40 [39];
  
  force_00 = (bool)(in_CL & 1);
  std::__cxx11::string::string(local_40,in_RSI);
  reportArray(unaff_retaddr,in_RDI,(HighsInt)((ulong)in_RSI >> 0x20),in_RDX,force_00);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void HSimplexNla::reportArray(const std::string message, const HVector* vector,
                              const bool force) const {
  reportArray(message, 0, vector, force);
}